

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall chatra::RuntimeImp::removeBreakPoint(RuntimeImp *this,BreakPointId breakPointId)

{
  bool bVar1;
  IllegalRuntimeStateException *this_00;
  IllegalArgumentException *this_01;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>,_false>
  local_38;
  iterator it;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock0;
  BreakPointId breakPointId_local;
  RuntimeImp *this_local;
  
  lock0._M_device = (mutex_type *)breakPointId;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->lockDebugger);
  if ((this->paused & 1U) == 0) {
    this_00 = (IllegalRuntimeStateException *)__cxa_allocate_exception(0x28);
    (this_00->super_UnsupportedOperationException).super_NativeException.message._M_string_length =
         0;
    (this_00->super_UnsupportedOperationException).super_NativeException.message.field_2.
    _M_allocated_capacity = 0;
    *(undefined8 *)&(this_00->super_UnsupportedOperationException).super_NativeException = 0;
    *(undefined8 *)&(this_00->super_UnsupportedOperationException).super_NativeException.message = 0
    ;
    *(undefined8 *)
     ((long)&(this_00->super_UnsupportedOperationException).super_NativeException.message.field_2 +
     8) = 0;
    debugger::IllegalRuntimeStateException::IllegalRuntimeStateException(this_00);
    __cxa_throw(this_00,&debugger::IllegalRuntimeStateException::typeinfo,
                debugger::IllegalRuntimeStateException::~IllegalRuntimeStateException);
  }
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<chatra::debugger::BreakPointId,_chatra::BreakPoint,_std::hash<chatra::debugger::BreakPointId>,_std::equal_to<chatra::debugger::BreakPointId>,_std::allocator<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>_>_>
       ::find(&this->breakPoints,(key_type *)&lock0);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<chatra::debugger::BreakPointId,_chatra::BreakPoint,_std::hash<chatra::debugger::BreakPointId>,_std::equal_to<chatra::debugger::BreakPointId>,_std::allocator<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>_>_>
       ::cend(&this->breakPoints);
  bVar1 = std::__detail::operator==(&local_38,&local_40);
  if (!bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>,_false,_false>
                           *)&local_38);
    cancelBreakPoint(this,&ppVar2->second);
    std::
    unordered_map<chatra::debugger::BreakPointId,_chatra::BreakPoint,_std::hash<chatra::debugger::BreakPointId>,_std::equal_to<chatra::debugger::BreakPointId>,_std::allocator<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>_>_>
    ::erase(&this->breakPoints,(iterator)local_38._M_cur);
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
    return;
  }
  this_01 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
  (this_01->super_NativeException).message._M_string_length = 0;
  (this_01->super_NativeException).message.field_2._M_allocated_capacity = 0;
  *(undefined8 *)&this_01->super_NativeException = 0;
  *(undefined8 *)&(this_01->super_NativeException).message = 0;
  *(undefined8 *)((long)&(this_01->super_NativeException).message.field_2 + 8) = 0;
  IllegalArgumentException::IllegalArgumentException(this_01);
  __cxa_throw(this_01,&IllegalArgumentException::typeinfo,
              IllegalArgumentException::~IllegalArgumentException);
}

Assistant:

void RuntimeImp::removeBreakPoint(debugger::BreakPointId breakPointId) {
	CHATRA_CHECK_RUNTIME_PAUSED;

	auto it = breakPoints.find(breakPointId);
	if (it == breakPoints.cend())
		throw IllegalArgumentException();

	cancelBreakPoint(it->second);
	breakPoints.erase(it);
}